

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePagesInternal
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint index,uint pageCount)

{
  char *pcVar1;
  PageAllocatorBaseCommon *pPVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  PreReservedVirtualAllocWrapper *this_00;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_01;
  
  if (pageCount != 0) {
    uVar5 = GetAvailablePageCount(this);
    if (pageCount + index <= uVar5) goto LAB_0070382e;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                     ,0x242,
                     "(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount())",
                     "pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount()");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
LAB_0070382e:
  BVStatic<272UL>::ClearRange(&this->freePages,index,pageCount);
  BVStatic<272UL>::SetRange(&this->decommitPages,index,pageCount);
  pcVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             *)&pPVar2[-1].allocatorType;
  if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
    this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *)0x0;
  }
  this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_01);
  PreReservedVirtualAllocWrapper::Free
            (this_00,pcVar1 + (index << 0xc),(ulong)(pageCount << 0xc),0x4000);
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitFreePagesInternal(uint index, uint pageCount)
{
    Assert(pageCount > 0 && (index + pageCount) <= this->GetAvailablePageCount());
    this->ClearRangeInFreePagesBitVector(index, pageCount);
    this->SetRangeInDecommitPagesBitVector(index, pageCount);

    char * currentAddress = this->address + (index * AutoSystemInfo::PageSize);
#pragma warning(suppress: 6250)
    this->GetAllocator()->GetVirtualAllocator()->Free(currentAddress,
      pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
}